

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall
HPresolve::getBoundOnLByZj
          (HPresolve *this,int row,int j,double *lo,double *up,double colLow,double colUpp)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double *local_80;
  
  uVar19 = (ulong)j;
  pdVar5 = (this->super_HPreData).colCostAtEl.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(this->super_HPreData).colCostAtEl.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish - (long)pdVar5 >> 3;
  uVar13 = uVar19;
  if (uVar10 <= uVar19) {
LAB_001491a6:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13,
               uVar10);
  }
  piVar6 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
  if (uVar10 <= uVar19) goto LAB_001491a6;
  piVar7 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar7 >> 2;
  if (uVar10 <= uVar19) goto LAB_001491a6;
  dVar1 = pdVar5[uVar19];
  iVar3 = piVar6[uVar19];
  uVar12 = (ulong)iVar3;
  iVar4 = piVar7[uVar19];
  dVar21 = 0.0;
  iVar9 = iVar4;
  if (iVar4 < iVar3) {
    iVar9 = iVar3;
  }
  if (iVar3 < iVar4) {
    piVar6 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
    piVar7 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar7 >> 2;
    pdVar5 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar15 = (long)(this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
    pdVar8 = (this->super_HPreData).valueRowDual.super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (long)(this->super_HPreData).valueRowDual.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
    uVar17 = uVar12;
    do {
      if (uVar11 <= uVar17) {
        uVar10 = uVar11;
        uVar13 = uVar12;
        if (uVar12 < uVar11) {
          uVar13 = uVar11;
        }
        goto LAB_001491a6;
      }
      uVar18 = (ulong)piVar6[uVar17];
      uVar10 = uVar14;
      uVar13 = uVar18;
      if (uVar14 <= uVar18) goto LAB_001491a6;
      if (piVar7[uVar18] != 0) {
        uVar10 = uVar15;
        uVar13 = uVar17;
        if ((uVar15 <= uVar17) || (uVar10 = uVar16, uVar13 = uVar18, uVar16 <= uVar18))
        goto LAB_001491a6;
        dVar21 = dVar21 + pdVar5[uVar17] * pdVar8[uVar18];
      }
      uVar17 = uVar17 + 1;
    } while ((long)iVar9 != uVar17);
  }
  dVar20 = HPreData::getaij(&this->super_HPreData,row,j);
  dVar2 = this->tol;
  if (ABS(colLow - colUpp) < dVar2) {
    return;
  }
  pdVar5 = (this->super_HPreData).valuePrimal.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(this->super_HPreData).valuePrimal.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish - (long)pdVar5 >> 3;
  uVar13 = uVar19;
  if (uVar10 <= uVar19) goto LAB_001491a6;
  dVar21 = (-dVar1 - dVar21) / dVar20;
  dVar1 = pdVar5[uVar19];
  if ((dVar1 - colLow <= dVar2) || (colUpp - dVar1 <= dVar2)) {
    if (0.0 <= dVar20) {
LAB_001490ef:
      if ((dVar20 <= 0.0) || ((dVar1 != colUpp || (NAN(dVar1) || NAN(colUpp))))) {
        if ((dVar20 <= 0.0 || colLow != dVar1) && (0.0 <= dVar20 || dVar1 != colUpp)) {
          return;
        }
        goto LAB_001490d0;
      }
    }
    else if ((dVar1 != colLow) || (NAN(dVar1) || NAN(colLow))) goto LAB_001490ef;
    local_80 = up;
    if (*up <= dVar21) {
      return;
    }
  }
  else {
    if (dVar21 < *up) {
      *up = dVar21;
    }
LAB_001490d0:
    local_80 = lo;
    if (dVar21 < *lo || dVar21 == *lo) {
      return;
    }
  }
  *local_80 = dVar21;
  return;
}

Assistant:

void HPresolve::getBoundOnLByZj(int row, int j, double* lo, double* up, double colLow, double colUpp) {

	double cost = colCostAtEl.at(j);//valueColDual.at(j);
	double x = -cost;

	double sum = 0;
	for (int kk=Astart.at(j); kk<Aend.at(j);++kk)
		if (flagRow.at(Aindex.at(kk))) {
			sum = sum + Avalue.at(kk)*valueRowDual.at(Aindex.at(kk));
		}
	x = x - sum;

	double aij=getaij(row,j);
	x = x/aij;


	if (abs(colLow-colUpp) < tol)
		return; //here there is no restriction on zj so no bound on y

	if ((valuePrimal.at(j) - colLow) > tol && (colUpp - valuePrimal.at(j)) > tol) {
		//set both bounds
		if (x<*up)
			*up = x;
		if (x>*lo)
			*lo = x;
	}

	else if ((valuePrimal.at(j) == colLow && aij<0) || (valuePrimal.at(j) == colUpp && aij>0)) {
		if (x<*up)
			*up = x;
	}
	else if ((valuePrimal.at(j) == colLow && aij>0) || (valuePrimal.at(j) == colUpp && aij<0)) {
		if (x>*lo)
			*lo = x;
	}
}